

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall
soplex::SPxSolverBase<double>::loadLP
          (SPxSolverBase<double> *this,SPxLPBase<double> *lp,bool initSlackBasis)

{
  byte bVar1;
  byte in_DL;
  SPxBasisBase<double> *in_RSI;
  SPxSolverBase<double> *in_RDI;
  SPxLPBase<double> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x1b])();
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])();
  (*(in_RDI->super_SPxBasisBase<double>)._vptr_SPxBasisBase[8])(&in_RDI->super_SPxBasisBase<double>)
  ;
  resetClockStats(in_RDI);
  if (in_RDI->thepricer != (SPxPricer<double> *)0x0) {
    (*in_RDI->thepricer->_vptr_SPxPricer[2])();
  }
  if (in_RDI->theratiotester != (SPxRatioTester<double> *)0x0) {
    (*in_RDI->theratiotester->_vptr_SPxRatioTester[2])();
  }
  SPxLPBase<double>::operator=(&in_RDI->super_SPxLPBase<double>,in_stack_ffffffffffffffd8);
  (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x79])();
  SPxBasisBase<double>::load
            (in_RSI,(SPxSolverBase<double> *)CONCAT17(bVar1,in_stack_ffffffffffffffe8),
             SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

void SPxSolverBase<R>::loadLP(const SPxLPBase<R>& lp, bool initSlackBasis)
{
   clear();
   unInit();
   this->unLoad();
   resetClockStats();

   if(thepricer)
      thepricer->clear();

   if(theratiotester)
      theratiotester->clear();

   SPxLPBase<R>::operator=(lp);
   reDim();
   SPxBasisBase<R>::load(this, initSlackBasis);
}